

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_26d854::OSScapture::stop(OSScapture *this)

{
  __int_type_conflict _Var1;
  int iVar2;
  
  LOCK();
  _Var1 = (this->mKillNow)._M_base._M_i;
  (this->mKillNow)._M_base._M_i = true;
  UNLOCK();
  if (((_Var1 & 1U) == 0) && ((this->mThread)._M_id._M_thread != 0)) {
    std::thread::join();
    iVar2 = ioctl(this->mFd,0x5000);
    if ((iVar2 != 0) && (0 < (int)gLogLevel)) {
      _GLOBAL__N_1::OSScapture::stop();
    }
  }
  return;
}

Assistant:

void OSScapture::stop()
{
    if(mKillNow.exchange(true, std::memory_order_acq_rel) || !mThread.joinable())
        return;
    mThread.join();

    if(ioctl(mFd, SNDCTL_DSP_RESET) != 0)
        ERR("Error resetting device: %s\n", strerror(errno));
}